

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentation.cxx
# Opt level: O2

bool __thiscall cmDocumentation::PrintHelpListManuals(cmDocumentation *this,ostream *os)

{
  cmDocumentation *this_00;
  allocator<char> local_31;
  
  this_00 = (cmDocumentation *)&stack0xffffffffffffffd0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xffffffffffffffd0,"manual/*",&local_31);
  PrintNames(this_00,os,(string *)&stack0xffffffffffffffd0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  return true;
}

Assistant:

bool cmDocumentation::PrintHelpListManuals(std::ostream& os)
{
  this->PrintNames(os, "manual/*");
  return true;
}